

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Smf.cpp
# Opt level: O0

uchar rlib::midi::Smf::Inner::read<unsigned_char_const>(istream *is)

{
  long lVar1;
  runtime_error *this;
  char *in_RDI;
  type_conflict7 buf;
  uchar local_9 [9];
  
  std::istream::read(in_RDI,(long)local_9);
  lVar1 = std::istream::gcount();
  if (lVar1 == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"size error");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_9[0];
}

Assistant:

static T read(std::istream& is) {
		typename std::remove_const<T>::type buf;
		if (is.read(reinterpret_cast<char*>(&buf), sizeof(buf)).gcount() < sizeof(buf)) {
			throw std::runtime_error("size error");
		}
		return buf;
	}